

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

size_t pretty_abi_cxx11_(size_t value,size_t scale,char **units,int m)

{
  undefined4 in_register_0000000c;
  int in_R8D;
  float local_17c;
  float local_16c;
  float local_150;
  allocator local_139;
  char local_138 [8];
  char buffer [256];
  int local_30;
  float d;
  int count;
  int m_local;
  char **units_local;
  size_t scale_local;
  size_t value_local;
  
  local_30 = 0;
  local_150 = (float)scale;
  for (buffer._252_4_ = local_150; local_16c = (float)units,
      local_16c < (float)buffer._252_4_ && local_30 < in_R8D + -1;
      buffer._252_4_ = (float)buffer._252_4_ / local_17c) {
    local_17c = (float)units;
    local_30 = local_30 + 1;
  }
  sprintf(local_138,"%.6f %s",(double)(float)buffer._252_4_,
          *(undefined8 *)(CONCAT44(in_register_0000000c,m) + (long)local_30 * 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)value,local_138,&local_139);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  return value;
}

Assistant:

std::string pretty(size_t value, size_t scale, const char* *units, int m) {
    int count = 0;
    float d = value;
    while (d > scale && count < m - 1) {
        d /= scale;
        count += 1;
    }
    char buffer[256];
    sprintf(buffer, "%.6f %s", d, units[count]);
    return buffer;
}